

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_fifo.c
# Opt level: O0

mk_fifo_queue * mk_fifo_queue_get(mk_fifo *ctx,int id)

{
  mk_list **ppmVar1;
  mk_list *__mptr;
  mk_fifo_queue *q;
  mk_list *head;
  int id_local;
  mk_fifo *ctx_local;
  
  q = (mk_fifo_queue *)(ctx->queues).next;
  while( true ) {
    if (q == (mk_fifo_queue *)&ctx->queues) {
      return (mk_fifo_queue *)0x0;
    }
    ppmVar1 = &q[-1]._head.next;
    if ((uint)*(ushort *)ppmVar1 == id) break;
    q = *(mk_fifo_queue **)(q->name + 6);
  }
  return (mk_fifo_queue *)ppmVar1;
}

Assistant:

struct mk_fifo_queue *mk_fifo_queue_get(struct mk_fifo *ctx, int id)
{
    struct mk_list *head;
    struct mk_fifo_queue *q = NULL;

    mk_list_foreach(head, &ctx->queues) {
        q = mk_list_entry(head, struct mk_fifo_queue, _head);
        if (q->id == id) {
            return q;
        }
    }

    return NULL;
}